

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

void __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::joinString
          (Interpreter *this,bool *first,UString *running,Value *sep,uint idx,Value *elt)

{
  HeapEntity *pHVar1;
  size_type __n;
  pointer pFVar2;
  ostream *poVar3;
  RuntimeError *__return_storage_ptr__;
  Type t;
  stringstream ss;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  if (elt->t == NULL_TYPE) {
    return;
  }
  if (elt->t == STRING) {
    if (*first == false) {
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      _M_append(running,*(char32_t **)(sep + 1),(size_type)sep[1].v);
    }
    *first = false;
    pHVar1 = (elt->v).h;
    __n._0_1_ = pHVar1[1].mark;
    __n._1_1_ = pHVar1[1].type;
    __n._2_6_ = *(undefined6 *)&pHVar1[1].field_0xa;
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    _M_append(running,(char32_t *)pHVar1[1]._vptr_HeapEntity,__n);
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"expected string but arr[",0x18);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] was ",6);
  (anonymous_namespace)::type_str_abi_cxx11_(&local_1d0,(_anonymous_namespace_ *)(ulong)elt->t,t);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  __return_storage_ptr__ = (RuntimeError *)__cxa_allocate_exception(0x38);
  pFVar2 = (this->stack).stack.
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::stringbuf::str();
  Stack::makeError(__return_storage_ptr__,&this->stack,&pFVar2[-1].location,&local_1d0);
  __cxa_throw(__return_storage_ptr__,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

void joinString(bool &first, UString &running, const Value &sep, unsigned idx, const Value &elt)
    {
        if (elt.t == Value::NULL_TYPE) {
            return;
        }
        if (elt.t != Value::STRING) {
            std::stringstream ss;
            ss << "expected string but arr[" << idx << "] was " << type_str(elt);
            throw makeError(stack.top().location, ss.str());
        }
        if (!first) {
            running.append(static_cast<HeapString *>(sep.v.h)->value);
        }
        first = false;
        running.append(static_cast<HeapString *>(elt.v.h)->value);
    }